

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O2

void __thiscall CMU462::HalfedgeMesh::splitPolygon(HalfedgeMesh *this,FaceIter f)

{
  _List_node_base *p_Var1;
  Size SVar2;
  FaceIter FVar3;
  EdgeIter EVar4;
  HalfedgeIter HVar5;
  HalfedgeIter HVar6;
  _List_node_base *p_Var7;
  pointer p_Var8;
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  vertexes;
  _Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  local_68;
  _List_node_base *local_48;
  _List_node_base *local_40;
  pointer local_38;
  
  SVar2 = Face::degree((Face *)(f._M_node + 1));
  if (3 < SVar2) {
    HVar5._M_node = f._M_node[0xb]._M_prev;
    local_40 = HVar5._M_node[2]._M_prev;
    local_48 = (_List_node_base *)prev_Halfedge(HVar5);
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    p_Var7 = HVar5._M_node[2]._M_next[2]._M_next;
    do {
      std::
      vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
      ::push_back((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                   *)&local_68,(value_type *)&p_Var7[2]._M_prev);
      p_Var7 = p_Var7[2]._M_next;
    } while (f._M_node[0xb]._M_prev != p_Var7);
    local_68._M_impl.super__Vector_impl_data._M_finish =
         local_68._M_impl.super__Vector_impl_data._M_finish + -1;
    local_38 = local_68._M_impl.super__Vector_impl_data._M_finish;
    for (p_Var8 = local_68._M_impl.super__Vector_impl_data._M_start; p_Var8 != local_38;
        p_Var8 = p_Var8 + 1) {
      p_Var7 = p_Var8->_M_node;
      FVar3 = newFace(this);
      EVar4 = newEdge(this);
      HVar5 = newHalfedge(this);
      HVar6 = newHalfedge(this);
      p_Var1 = f._M_node[0xb]._M_prev;
      HVar5._M_node[3]._M_next = EVar4._M_node;
      HVar6._M_node[3]._M_next = EVar4._M_node;
      EVar4._M_node[6]._M_prev = HVar5._M_node;
      HVar5._M_node[1]._M_prev = HVar6._M_node;
      HVar6._M_node[1]._M_prev = HVar5._M_node;
      HVar5._M_node[2]._M_prev = p_Var7;
      p_Var7[0xf]._M_prev = HVar5._M_node;
      HVar6._M_node[2]._M_prev = local_40;
      local_40[0xf]._M_prev = HVar6._M_node;
      HVar5._M_node[3]._M_prev = FVar3._M_node;
      FVar3._M_node[0xb]._M_prev = HVar5._M_node;
      HVar6._M_node[3]._M_prev = f._M_node;
      f._M_node[0xb]._M_prev = HVar6._M_node;
      HVar6._M_node[2]._M_next = p_Var1[2]._M_next[2]._M_next;
      p_Var1[2]._M_next[2]._M_next = HVar5._M_node;
      HVar5._M_node[2]._M_next = p_Var1;
      local_48[2]._M_next = HVar6._M_node;
      p_Var1[3]._M_prev = FVar3._M_node;
      p_Var1[2]._M_next[3]._M_prev = FVar3._M_node;
    }
    std::
    _Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ::~_Vector_base(&local_68);
  }
  return;
}

Assistant:

void HalfedgeMesh::splitPolygon(FaceIter f) {
	// TODO: (meshedit) 
	// Triangulate a polygonal face
	if (f->degree() < 4) return;

	VertexIter main_vertex = f->halfedge()->vertex();
	HalfedgeIter last_Halfedge = prev_Halfedge(f->halfedge());
	vector<VertexIter> vertexes;

	HalfedgeIter temp = f->halfedge()->next()->next();
	do {
		vertexes.push_back(temp->vertex());
		temp = temp->next();
	} while (temp != f->halfedge());
	vertexes.pop_back();


	for (VertexIter curr_vertex : vertexes) {
		FaceIter new_Face = newFace();
		EdgeIter new_Edge = newEdge();
		HalfedgeIter new_Halfedge1 = newHalfedge();
		HalfedgeIter new_Halfedge2 = newHalfedge();

		HalfedgeIter main_Halfedge = f->halfedge();

		new_Halfedge1->edge() = new_Edge;
		new_Halfedge2->edge() = new_Edge;
		new_Edge->halfedge() = new_Halfedge1;

		new_Halfedge1->twin() = new_Halfedge2;
		new_Halfedge2->twin() = new_Halfedge1;

		new_Halfedge1->vertex() = curr_vertex;
		curr_vertex->halfedge() = new_Halfedge1;
		new_Halfedge2->vertex() = main_vertex;
		main_vertex->halfedge() = new_Halfedge2;

		new_Halfedge1->face() = new_Face;
		new_Face->halfedge() = new_Halfedge1;
		new_Halfedge2->face() = f;
		f->halfedge() = new_Halfedge2;

		new_Halfedge2->next() = main_Halfedge->next()->next();
		main_Halfedge->next()->next() = new_Halfedge1;
		new_Halfedge1->next() = main_Halfedge;
		last_Halfedge->next() = new_Halfedge2;

		main_Halfedge->face() = new_Face;
		main_Halfedge->next()->face() = new_Face;
	}

	//showError("splitPolygon() not implemented.");
}